

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_get_dimensions_instruction(Impl *impl,CallInst *instruction)

{
  mapped_type *this;
  Builder *pBVar1;
  Builder *value;
  CallInst *pCVar2;
  bool bVar3;
  Id IVar4;
  uint uVar5;
  uint uVar6;
  Dim DVar7;
  Value *pVVar8;
  Operation *pOVar9;
  Op op_00;
  byte local_119;
  uint local_ec;
  uint i;
  Operation *op;
  Operation *aux_op;
  initializer_list<unsigned_int> local_d0;
  uint local_c0;
  Id local_bc;
  initializer_list<unsigned_int> local_b8;
  uint local_a8;
  Id local_a4;
  initializer_list<unsigned_int> local_a0;
  Operation *local_90;
  Operation *elem_count_op;
  initializer_list<unsigned_int> local_80;
  Operation *local_70;
  Operation *byte_size_op;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  Id dim_type_id;
  bool is_uav;
  bool has_lod;
  bool has_samples;
  Builder *pBStack_58;
  uint32_t num_coords;
  mapped_type *local_50;
  mapped_type *access_meta;
  Operation *dimensions_op;
  mapped_type *pmStack_38;
  uint32_t ssbo_element_size;
  mapped_type *meta;
  Id image_type_id;
  Id image_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  bVar3 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (bVar3) {
    _image_type_id = Converter::Impl::builder((Impl *)instruction_local);
    pCVar2 = instruction_local;
    pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar8,0);
    meta._0_4_ = Converter::Impl::get_type_id((Impl *)instruction_local,meta._4_4_);
    pmStack_38 = std::
                 unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                 ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                               *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                  _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
    dimensions_op._4_4_ = 4;
    access_meta = (mapped_type *)0x0;
    pBStack_58 = builder;
    local_50 = std::
               unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
               ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                             *)&instruction_local[10].super_Instruction.attachments._M_h.
                                _M_before_begin,(key_type *)&stack0xffffffffffffffa8);
    pCVar2 = instruction_local;
    dim_type_id = 0;
    local_5d = 0;
    local_5e = 0;
    if (pmStack_38->storage == StorageClassStorageBuffer) {
      if (pmStack_38->index_offset_id == 0) {
        IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
        access_meta = (mapped_type *)Converter::Impl::allocate((Impl *)pCVar2,OpArrayLength,IVar4);
        Operation::add_id((Operation *)access_meta,meta._4_4_);
        Operation::add_literal((Operation *)access_meta,0);
      }
      else {
        IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
        access_meta = (mapped_type *)
                      Converter::Impl::allocate((Impl *)pCVar2,OpCompositeExtract,IVar4);
        Operation::add_id((Operation *)access_meta,pmStack_38->index_offset_id);
        Operation::add_literal((Operation *)access_meta,1);
      }
      uVar5 = raw_vecsize_to_vecsize(pmStack_38->raw_component_vecsize);
      uVar6 = raw_component_type_to_bits(pmStack_38->component_type);
      dimensions_op._4_4_ = uVar5 * uVar6 >> 3;
      Converter::Impl::add((Impl *)instruction_local,(Operation *)access_meta,false);
      dim_type_id = 1;
    }
    else if (pmStack_38->index_offset_id == 0) {
      bVar3 = get_image_dimensions_query_size
                        ((Impl *)instruction_local,_image_type_id,meta._4_4_,&dim_type_id);
      if (!bVar3) {
        return false;
      }
      local_5f = spv::Builder::isStorageImageType(_image_type_id,(Id)meta);
      local_5d = spv::Builder::isMultisampledImageType(_image_type_id,(Id)meta);
      local_119 = 0;
      if ((local_5f & 1) == 0) {
        DVar7 = spv::Builder::getTypeDimensionality(_image_type_id,(Id)meta);
        local_119 = 0;
        if (DVar7 != DimBuffer) {
          local_119 = local_5d ^ 0xff;
        }
      }
      local_5e = local_119 & 1;
      byte_size_op._4_4_ = spv::Builder::makeUintType(_image_type_id,0x20);
      if (1 < dim_type_id) {
        byte_size_op._4_4_ =
             spv::Builder::makeVectorType(_image_type_id,byte_size_op._4_4_,dim_type_id);
      }
      if ((local_50->access_mask & 7) == 0) {
        dim_type_id = 0;
      }
      else {
        op_00 = OpImageQuerySize;
        if ((local_5e & 1) != 0) {
          op_00 = OpImageQuerySizeLod;
        }
        access_meta = (mapped_type *)
                      Converter::Impl::allocate((Impl *)instruction_local,op_00,byte_size_op._4_4_);
        Operation::add_id((Operation *)access_meta,meta._4_4_);
        pCVar2 = instruction_local;
        this = access_meta;
        if ((local_5e & 1) != 0) {
          pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
          IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar8,0);
          Operation::add_id((Operation *)this,IVar4);
        }
        Converter::Impl::add((Impl *)instruction_local,(Operation *)access_meta,false);
      }
    }
    else {
      IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
      access_meta = (mapped_type *)
                    Converter::Impl::allocate((Impl *)pCVar2,OpCompositeExtract,IVar4);
      Operation::add_id((Operation *)access_meta,pmStack_38->index_offset_id);
      Operation::add_literal((Operation *)access_meta,1);
      Converter::Impl::add((Impl *)instruction_local,(Operation *)access_meta,false);
      dim_type_id = 1;
    }
    pCVar2 = instruction_local;
    if (pmStack_38->kind == RawBuffer) {
      IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
      pOVar9 = Converter::Impl::allocate((Impl *)pCVar2,OpIMul,IVar4);
      elem_count_op._0_4_ = access_meta->components;
      local_70 = pOVar9;
      elem_count_op._4_4_ = spv::Builder::makeUintConstant(_image_type_id,dimensions_op._4_4_,false)
      ;
      local_80._M_array = (iterator)&elem_count_op;
      local_80._M_len = 2;
      Operation::add_ids(pOVar9,&local_80);
      Converter::Impl::add((Impl *)instruction_local,local_70,false);
      access_meta = (mapped_type *)local_70;
    }
    else if (pmStack_38->kind == StructuredBuffer) {
      IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
      pOVar9 = Converter::Impl::allocate((Impl *)pCVar2,OpUDiv,IVar4);
      local_90 = pOVar9;
      if (pmStack_38->index_offset_id == 0) {
        aux_op._0_4_ = access_meta->components;
        aux_op._4_4_ = spv::Builder::makeUintConstant
                                 (_image_type_id,pmStack_38->stride / dimensions_op._4_4_,false);
        local_d0._M_array = (iterator)&aux_op;
        local_d0._M_len = 2;
        Operation::add_ids(pOVar9,&local_d0);
      }
      else if ((pmStack_38->aliased & 1U) == 0) {
        local_a8 = access_meta->components;
        local_a4 = spv::Builder::makeUintConstant
                             (_image_type_id,pmStack_38->stride / dimensions_op._4_4_,false);
        local_a0._M_array = &local_a8;
        local_a0._M_len = 2;
        Operation::add_ids(pOVar9,&local_a0);
      }
      else {
        local_c0 = access_meta->components;
        local_bc = spv::Builder::makeUintConstant(_image_type_id,pmStack_38->stride,false);
        local_b8._M_array = &local_c0;
        local_b8._M_len = 2;
        Operation::add_ids(pOVar9,&local_b8);
      }
      Converter::Impl::add((Impl *)instruction_local,local_90,false);
      access_meta = (mapped_type *)local_90;
    }
    pCVar2 = instruction_local;
    op = (Operation *)0x0;
    if ((local_50->access_mask & 8) != 0) {
      if ((local_5e & 1) == 0) {
        if ((local_5d & 1) != 0) {
          IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
          op = Converter::Impl::allocate((Impl *)pCVar2,OpImageQuerySamples,IVar4);
          Operation::add_id(op,meta._4_4_);
          Converter::Impl::add((Impl *)instruction_local,op,false);
        }
      }
      else {
        IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
        op = Converter::Impl::allocate((Impl *)pCVar2,OpImageQueryLevels,IVar4);
        Operation::add_id(op,meta._4_4_);
        Converter::Impl::add((Impl *)instruction_local,op,false);
      }
    }
    pCVar2 = instruction_local;
    value = builder;
    pBVar1 = _image_type_id;
    if (op == (Operation *)0x0 && access_meta == (mapped_type *)0x0) {
      __assert_fail("aux_op || dimensions_op",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/dxil/dxil_sampling.cpp"
                    ,0x40e,
                    "bool dxil_spv::emit_get_dimensions_instruction(Converter::Impl &, const LLVMBC::CallInst *)"
                   );
    }
    if ((op == (Operation *)0x0) && (access_meta != (mapped_type *)0x0)) {
      if (dim_type_id == 1) {
        local_50->forced_composite = false;
      }
      Converter::Impl::rewrite_value
                ((Impl *)instruction_local,(Value *)builder,access_meta->components);
    }
    else if (access_meta == (mapped_type *)0x0) {
      local_50->forced_composite = false;
      local_50->access_mask = 1;
      local_50->components = 1;
      Converter::Impl::rewrite_value((Impl *)instruction_local,(Value *)builder,op->id);
    }
    else {
      IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
      IVar4 = spv::Builder::makeVectorType(pBVar1,IVar4,4);
      pOVar9 = Converter::Impl::allocate((Impl *)pCVar2,OpCompositeConstruct,(Value *)value,IVar4);
      Operation::add_id(pOVar9,access_meta->components);
      for (local_ec = dim_type_id; pBVar1 = _image_type_id, local_ec < 3; local_ec = local_ec + 1) {
        IVar4 = spv::Builder::makeUintType(_image_type_id,0x20);
        IVar4 = spv::Builder::createUndefined(pBVar1,IVar4);
        Operation::add_id(pOVar9,IVar4);
      }
      Operation::add_id(pOVar9,op->id);
      Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
    }
    spv::Builder::addCapability(_image_type_id,CapabilityImageQuery);
  }
  return true;
}

Assistant:

bool emit_get_dimensions_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	auto &meta = impl.handle_to_resource_meta[image_id];

	uint32_t ssbo_element_size = 4;

	Operation *dimensions_op = nullptr;
	auto &access_meta = impl.llvm_composite_meta[instruction];
	uint32_t num_coords = 0;
	bool has_samples = false;
	bool has_lod = false;

	if (meta.storage == spv::StorageClassStorageBuffer)
	{
		if (meta.index_offset_id)
		{
			dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
			dimensions_op->add_id(meta.index_offset_id);
			dimensions_op->add_literal(1);
		}
		else
		{
			dimensions_op = impl.allocate(spv::OpArrayLength, builder.makeUintType(32));
			dimensions_op->add_id(image_id);
			dimensions_op->add_literal(0);
		}

		ssbo_element_size = raw_vecsize_to_vecsize(meta.raw_component_vecsize) *
		                    raw_component_type_to_bits(meta.component_type) / 8;

		impl.add(dimensions_op);
		num_coords = 1;
	}
	else if (meta.index_offset_id)
	{
		dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
		dimensions_op->add_id(meta.index_offset_id);
		dimensions_op->add_literal(1);
		impl.add(dimensions_op);
		num_coords = 1;
	}
	else
	{
		if (!get_image_dimensions_query_size(impl, builder, image_id, &num_coords))
			return false;

		bool is_uav = builder.isStorageImageType(image_type_id);
		has_samples = builder.isMultisampledImageType(image_type_id);
		has_lod = !is_uav && builder.getTypeDimensionality(image_type_id) != spv::DimBuffer && !has_samples;

		spv::Id dim_type_id = builder.makeUintType(32);
		if (num_coords > 1)
			dim_type_id = builder.makeVectorType(dim_type_id, num_coords);

		if ((access_meta.access_mask & 7) != 0)
		{
			dimensions_op = impl.allocate(has_lod ? spv::OpImageQuerySizeLod : spv::OpImageQuerySize, dim_type_id);
			dimensions_op->add_id(image_id);
			if (has_lod)
				dimensions_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
			impl.add(dimensions_op);
		}
		else
			num_coords = 0;
	}

	if (meta.kind == DXIL::ResourceKind::RawBuffer)
	{
		Operation *byte_size_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		byte_size_op->add_ids({ dimensions_op->id, builder.makeUintConstant(ssbo_element_size) });
		impl.add(byte_size_op);
		dimensions_op = byte_size_op;
	}
	else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
	{
		Operation *elem_count_op = impl.allocate(spv::OpUDiv, builder.makeUintType(32));

		if (meta.index_offset_id != 0)
		{
			// If the offset buffer is pre-shifted, shift the divider as well.
			if (!meta.aliased)
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });
			else
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride) });
		}
		else
			elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });

		impl.add(elem_count_op);
		dimensions_op = elem_count_op;
	}

	Operation *aux_op = nullptr;
	if ((access_meta.access_mask & (1u << 3)) != 0)
	{
		if (has_lod)
		{
			aux_op = impl.allocate(spv::OpImageQueryLevels, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
		else if (has_samples)
		{
			aux_op = impl.allocate(spv::OpImageQuerySamples, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
	}

	assert(aux_op || dimensions_op);

	if (!aux_op && dimensions_op)
	{
		if (num_coords == 1)
			access_meta.forced_composite = false;
		impl.rewrite_value(instruction, dimensions_op->id);
	}
	else if (dimensions_op)
	{
		Operation *op =
		    impl.allocate(spv::OpCompositeConstruct, instruction, builder.makeVectorType(builder.makeUintType(32), 4));
		op->add_id(dimensions_op->id);

		// This element cannot be statically accessed if we don't have LOD, so don't bother returning anything here.
		// Otherwise, we need to pad out.
		for (unsigned i = num_coords; i < 3; i++)
			op->add_id(builder.createUndefined(builder.makeUintType(32)));
		op->add_id(aux_op->id);

		impl.add(op);
	}
	else
	{
		// Redirect any extract from this scalar to be preserved as-is.
		// Pretend this is a scalar even if Levels/Samples query is supposed to live in W.
		access_meta.forced_composite = false;
		access_meta.access_mask = 1;
		access_meta.components = 1;
		impl.rewrite_value(instruction, aux_op->id);
	}

	builder.addCapability(spv::CapabilityImageQuery);
	return true;
}